

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O1

date_t duckdb::DateTrunc::
       UnaryFunction<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::DecadeOperator>(date_t input)

{
  bool bVar1;
  int32_t iVar2;
  date_t dVar3;
  undefined1 auVar4 [12];
  date_t result;
  date_t in_stack_ffffffffffffffbc;
  date_t local_3c;
  string local_38;
  
  bVar1 = Value::IsFinite<duckdb::date_t>(input);
  if (bVar1) {
    iVar2 = Date::ExtractYear(in_stack_ffffffffffffffbc);
    dVar3 = Date::FromDate((iVar2 / 10) * 10,1,1);
    return (date_t)dVar3.days;
  }
  bVar1 = TryCast::Operation<duckdb::date_t,duckdb::date_t>(input,&local_3c,false);
  if (bVar1) {
    return (date_t)local_3c.days;
  }
  auVar4 = __cxa_allocate_exception(0x10);
  CastExceptionText<duckdb::date_t,duckdb::date_t>
            (&local_38,(duckdb *)(ulong)(uint)input.days,(date_t)auVar4._8_4_);
  InvalidInputException::InvalidInputException(auVar4._0_8_,&local_38);
  __cxa_throw(auVar4._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR UnaryFunction(TA input) {
		if (Value::IsFinite(input)) {
			return OP::template Operation<TA, TR>(input);
		} else {
			return Cast::template Operation<TA, TR>(input);
		}
	}